

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

void * __thiscall asmjit::VMemMgr::alloc(VMemMgr *this,size_t size,uint32_t type)

{
  PermanentNode **ppPVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  size_t __size;
  MemNode *pMVar5;
  bool bVar6;
  ulong len;
  ulong uVar7;
  PermanentNode *__s;
  ulong uVar8;
  MemNode *__ptr;
  MemNode *pMVar9;
  MemNode *pMVar10;
  MemNode **ppMVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  MemNode *pMVar19;
  uint uVar20;
  ulong *buf;
  RbNode *pRVar21;
  ulong uVar22;
  MemNode *pMVar23;
  RbNode *pRVar24;
  ulong uVar25;
  long lVar26;
  uint8_t *puVar27;
  RbNode **ppRVar28;
  long lVar29;
  MemNode *pMVar30;
  ulong uVar31;
  bool bVar32;
  RbNode *local_58;
  MemNode *pMStack_50;
  uint8_t *puStack_48;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  
  uVar31 = size + 0x1f & 0xffffffffffffffe0;
  if (type == 1) {
    pthread_mutex_lock((pthread_mutex_t *)this);
    ppPVar1 = &this->_permanent;
    __s = (PermanentNode *)ppPVar1;
    do {
      __s = __s->prev;
      if (__s == (PermanentNode *)0x0) {
        __s = (PermanentNode *)malloc(0x20);
        if (__s == (PermanentNode *)0x0) goto LAB_0015135c;
        sVar17 = 0x8000;
        if (0x8000 < uVar31) {
          sVar17 = uVar31;
        }
        puVar27 = (uint8_t *)OSUtils::allocVirtualMemory(sVar17,&__s->size,3);
        __s->mem = puVar27;
        if (puVar27 == (uint8_t *)0x0) goto LAB_00151357;
        __s->used = 0;
        __s->prev = *ppPVar1;
        sVar17 = 0;
        *ppPVar1 = __s;
        goto LAB_0015133f;
      }
      sVar17 = __s->used;
    } while (__s->size - sVar17 < uVar31);
    puVar27 = __s->mem;
LAB_0015133f:
    puVar27 = puVar27 + sVar17;
    __s->used = sVar17 + uVar31;
    this->_usedBytes = this->_usedBytes + uVar31;
  }
  else {
    if (uVar31 == 0) {
      return (void *)0x0;
    }
    pthread_mutex_lock((pthread_mutex_t *)this);
    uVar8 = this->_blockSize;
    ppMVar11 = &this->_optimal;
    pMVar10 = this->_optimal;
    pMVar9 = this->_optimal;
    while (__ptr = pMVar10, __ptr != (MemNode *)0x0) {
      uVar13 = __ptr->size - __ptr->used;
      if ((uVar13 < uVar31) || (__ptr->largestBlock != 0 && __ptr->largestBlock < uVar31)) {
        pMVar10 = __ptr->next;
        if ((uVar13 < uVar8) && (pMVar10 != (MemNode *)0x0 && __ptr == pMVar9)) {
          *ppMVar11 = pMVar10;
          pMVar9 = pMVar10;
        }
      }
      else {
        uVar13 = __ptr->density;
        buf = __ptr->baUsed;
        uVar18 = __ptr->blocks;
        uVar16 = 0;
        len = (uVar13 + (uVar31 - 1)) / uVar13;
        uVar7 = 0;
        puVar15 = buf;
        uVar25 = 0;
        while (uVar25 < uVar18) {
          uVar3 = *puVar15;
          puVar15 = puVar15 + 1;
          if (uVar3 == 0xffffffffffffffff) {
            if (uVar7 < uVar16) {
              uVar7 = uVar16;
            }
            uVar16 = 0;
            uVar25 = uVar25 + 0x40;
          }
          else {
            uVar2 = uVar25 + 0x40;
            lVar26 = -uVar25;
            uVar22 = uVar2;
            if (uVar18 < uVar2) {
              uVar22 = uVar18;
            }
            uVar14 = 1;
            for (; uVar25 = uVar2, -lVar26 != uVar22; lVar26 = lVar26 + -1) {
              if ((uVar14 & uVar3) == 0) {
                uVar25 = uVar16 + 1;
                if (uVar16 + 1 == len) {
                  sVar17 = -(uVar16 + lVar26);
                  goto LAB_00151282;
                }
              }
              else {
                if (uVar7 < uVar16) {
                  uVar7 = uVar16;
                }
                uVar25 = 0;
              }
              uVar16 = uVar25;
              uVar14 = uVar14 * 2;
            }
          }
        }
        __ptr->largestBlock = uVar7 * uVar13;
        pMVar10 = __ptr->next;
      }
    }
    uVar13 = this->_blockDensity;
    if (uVar8 <= uVar31) {
      uVar8 = uVar31;
    }
    puVar27 = (uint8_t *)OSUtils::allocVirtualMemory(uVar8,(size_t *)&stack0xffffffffffffffa8,3);
    pRVar21 = local_58;
    if (puVar27 != (uint8_t *)0x0) {
      uVar8 = (ulong)local_58 / uVar13;
      uVar18 = (uVar8 + 7 >> 3) + 7 & 0xfffffffffffffff8;
      __ptr = (MemNode *)malloc(0x68);
      __size = uVar18 * 2;
      __s = (PermanentNode *)malloc(__size);
      if ((__ptr != (MemNode *)0x0) && (__s != (PermanentNode *)0x0)) {
        (__ptr->super_RbNode).node[0] = (RbNode *)0x0;
        (__ptr->super_RbNode).node[1] = (RbNode *)0x0;
        (__ptr->super_RbNode).mem = puVar27;
        (__ptr->super_RbNode).red = 1;
        __ptr->prev = (MemNode *)0x0;
        __ptr->next = (MemNode *)0x0;
        __ptr->size = (size_t)pRVar21;
        __ptr->used = 0;
        __ptr->blocks = uVar8;
        __ptr->density = uVar13;
        __ptr->largestBlock = (size_t)pRVar21;
        uVar8 = 0;
        memset(__s,0,__size);
        __ptr->baUsed = (size_t *)__s;
        __ptr->baCont = (size_t *)((long)&__s->prev + uVar18);
        pMVar10 = this->_root;
        if (pMVar10 == (MemNode *)0x0) {
          this->_root = __ptr;
          pMVar10 = __ptr;
        }
        else {
          local_58 = (RbNode *)0x0;
          puStack_48 = (uint8_t *)0x0;
          uStack_40 = 0;
          uStack_3c = 0;
          pMStack_50 = pMVar10;
          pMVar5 = (MemNode *)0x0;
          pMVar9 = (MemNode *)0x0;
          pMVar30 = (MemNode *)&stack0xffffffffffffffa8;
          uVar20 = 0;
          while( true ) {
            pMVar23 = pMVar9;
            pMVar19 = pMVar5;
            uVar12 = (uint)uVar8;
            if (pMVar10 == (MemNode *)0x0) {
              (pMVar23->super_RbNode).node[uVar8] = (RbNode *)__ptr;
              pMVar9 = __ptr;
            }
            else {
              pRVar21 = (pMVar10->super_RbNode).node[0];
              pMVar9 = pMVar10;
              if ((((pRVar21 != (RbNode *)0x0) && (pRVar21->red != 0)) &&
                  (pRVar24 = (pMVar10->super_RbNode).node[1], pRVar24 != (RbNode *)0x0)) &&
                 (pRVar24->red != 0)) {
                (pMVar10->super_RbNode).red = 1;
                pRVar21->red = 0;
                pRVar24->red = 0;
              }
            }
            if (((pMVar23 != (MemNode *)0x0) && ((pMVar9->super_RbNode).red != 0)) &&
               ((pMVar23->super_RbNode).red != 0)) {
              bVar32 = uVar20 == 0;
              pMVar10 = (MemNode *)(pMVar30->super_RbNode).node[1];
              bVar6 = !bVar32;
              pRVar21 = (pMVar19->super_RbNode).node[bVar6];
              pRVar24 = pRVar21->node[bVar32];
              if (pMVar9 == (MemNode *)(pMVar23->super_RbNode).node[uVar20]) {
                ppRVar28 = pRVar21->node + bVar32;
              }
              else {
                uVar8 = (ulong)((uint)bVar6 * 8);
                pRVar21->node[bVar32] = *(RbNode **)((long)pRVar24->node + uVar8);
                *(RbNode **)((long)pRVar24->node + uVar8) = pRVar21;
                pRVar21->red = 1;
                *(RbNode **)((long)(pMVar19->super_RbNode).node + uVar8) = pRVar24;
                ppRVar28 = pRVar24->node + bVar32;
                pRVar21 = pRVar24;
                pRVar24 = pRVar24->node[bVar32];
              }
              (pMVar19->super_RbNode).node[bVar6] = pRVar24;
              *ppRVar28 = &pMVar19->super_RbNode;
              (pMVar19->super_RbNode).red = 1;
              pRVar21->red = 0;
              (pMVar30->super_RbNode).node[pMVar10 == pMVar19] = pRVar21;
            }
            if (pMVar9 == __ptr) break;
            uVar8 = (ulong)((pMVar9->super_RbNode).mem < (__ptr->super_RbNode).mem);
            pMVar10 = (MemNode *)(pMVar9->super_RbNode).node[uVar8];
            pMVar5 = pMVar23;
            uVar20 = uVar12;
            if (pMVar19 != (MemNode *)0x0) {
              pMVar30 = pMVar19;
            }
          }
          this->_root = pMStack_50;
          pMVar10 = pMStack_50;
        }
        (pMVar10->super_RbNode).red = 0;
        pMVar10 = this->_last;
        __ptr->prev = pMVar10;
        if (this->_first == (MemNode *)0x0) {
          this->_first = __ptr;
        }
        else {
          ppMVar11 = &pMVar10->next;
        }
        *ppMVar11 = __ptr;
        this->_last = __ptr;
        bVar6 = vMemMgrCheckTree(this);
        if (!bVar6) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/vmem.cpp"
                     ,0x291,"vMemMgrCheckTree(self)");
        }
        sVar17 = 0;
        len = ((uVar31 - 1) + __ptr->density) / __ptr->density;
        this->_allocatedBytes = this->_allocatedBytes + __ptr->size;
        buf = __ptr->baUsed;
LAB_00151282:
        _SetBits(buf,sVar17,len);
        _SetBits(__ptr->baCont,sVar17,len - 1);
        lVar29 = len * __ptr->density;
        lVar26 = __ptr->density * sVar17;
        __ptr->used = __ptr->used + lVar29;
        __ptr->largestBlock = 0;
        this->_usedBytes = this->_usedBytes + lVar29;
        if ((lVar26 < 0) ||
           (puVar4 = (__ptr->super_RbNode).mem, puVar27 = puVar4 + lVar26,
           puVar4 + (__ptr->size - uVar31) < puVar27)) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/vmem.cpp"
                     ,0x2aa,"result >= node->mem && result <= node->mem + node->size - vSize");
        }
        goto LAB_0015135f;
      }
      OSUtils::releaseVirtualMemory(puVar27,(size_t)pRVar21);
      free(__ptr);
LAB_00151357:
      free(__s);
    }
LAB_0015135c:
    puVar27 = (uint8_t *)0x0;
  }
LAB_0015135f:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return puVar27;
}

Assistant:

void* VMemMgr::alloc(size_t size, uint32_t type) noexcept {
  if (type == kAllocPermanent)
    return vMemMgrAllocPermanent(this, size);
  else
    return vMemMgrAllocFreeable(this, size);
}